

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_16::NameResolver::VisitExport(NameResolver *this,Export *export_)

{
  Export *export__local;
  NameResolver *this_local;
  
  switch(export_->kind) {
  case First:
    ResolveFuncVar(this,&export_->var);
    break;
  case Table:
    ResolveTableVar(this,&export_->var);
    break;
  case Memory:
    ResolveMemoryVar(this,&export_->var);
    break;
  case Global:
    ResolveGlobalVar(this,&export_->var);
    break;
  case Last:
    ResolveTagVar(this,&export_->var);
  }
  return;
}

Assistant:

void NameResolver::VisitExport(Export* export_) {
  switch (export_->kind) {
    case ExternalKind::Func:
      ResolveFuncVar(&export_->var);
      break;

    case ExternalKind::Table:
      ResolveTableVar(&export_->var);
      break;

    case ExternalKind::Memory:
      ResolveMemoryVar(&export_->var);
      break;

    case ExternalKind::Global:
      ResolveGlobalVar(&export_->var);
      break;

    case ExternalKind::Tag:
      ResolveTagVar(&export_->var);
      break;
  }
}